

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

Var Js::JavascriptRegExp::CallExec
              (RecyclableObject *thisObj,JavascriptString *string,PCWSTR varName,
              ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  bool bVar2;
  bool bVar3;
  Attributes attributes;
  BOOL BVar4;
  Var pvVar5;
  RecyclableObject *pRVar6;
  JavascriptMethod p_Var7;
  JavascriptRegExp *regularExpression;
  
  pvVar5 = JavascriptOperators::GetProperty(thisObj,0x83,scriptContext,(PropertyValueInfo *)0x0);
  bVar2 = JavascriptConversion::IsCallable(pvVar5);
  if (!bVar2) {
    regularExpression = ToRegExp(thisObj,varName,scriptContext);
    pvVar5 = RegexHelper::RegexExec(scriptContext,regularExpression,string,false,(void *)0x0);
    return pvVar5;
  }
  pRVar6 = UnsafeVarTo<Js::RecyclableObject>(pvVar5);
  this = scriptContext->threadContext;
  bVar2 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes(pRVar6);
  bVar3 = ThreadContext::HasNoSideEffect(this,pRVar6,attributes);
  if (bVar3) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(scriptContext->threadContext);
    if (scriptContext->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
    CheckIsExecutable(pRVar6,p_Var7);
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
    pRVar6 = (RecyclableObject *)
             (*p_Var7)(pRVar6,(CallInfo)pRVar6,0x2000002,0,0,0,0,0x2000002,thisObj,string);
    bVar3 = ThreadContext::IsOnStack(pRVar6);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      pRVar6 = (((((((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00d1637e;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(scriptContext->threadContext);
      if (scriptContext->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
      CheckIsExecutable(pRVar6,p_Var7);
      p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
      pRVar6 = (RecyclableObject *)
               (*p_Var7)(pRVar6,(CallInfo)pRVar6,0x2000002,0,0,0,0,0x2000002,thisObj,string);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00d1637e;
    }
    ThreadContext::CheckAndResetReentrancySafeOrHandled(scriptContext->threadContext);
    if (scriptContext->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
    CheckIsExecutable(pRVar6,p_Var7);
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
    pRVar6 = (RecyclableObject *)
             (*p_Var7)(pRVar6,(CallInfo)pRVar6,0x2000002,0,0,0,0,0x2000002,thisObj,string);
    bVar3 = ThreadContext::IsOnStack(pRVar6);
  }
  if (bVar3 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00d1637e:
  this->reentrancySafeOrHandled = bVar2;
  BVar4 = JavascriptOperators::IsObjectOrNull(pRVar6);
  if (BVar4 != 0) {
    return pRVar6;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e9f7,varName);
}

Assistant:

Var JavascriptRegExp::CallExec(RecyclableObject* thisObj, JavascriptString* string, PCWSTR varName, ScriptContext* scriptContext)
    {
        Var exec = JavascriptOperators::GetProperty(thisObj, PropertyIds::exec, scriptContext);
        if (JavascriptConversion::IsCallable(exec))
        {
            RecyclableObject* execFn = UnsafeVarTo<RecyclableObject>(exec);
            ThreadContext * threadContext = scriptContext->GetThreadContext();
            Var result = threadContext->ExecuteImplicitCall(execFn, ImplicitCall_Accessor, [=]()->Js::Var
            {
                return CALL_FUNCTION(scriptContext->GetThreadContext(), execFn, CallInfo(CallFlags_Value, 2), thisObj, string);
            });

            if (!JavascriptOperators::IsObjectOrNull(result))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_RegExpExecInvalidReturnType, varName);
            }

            return result;
        }

        JavascriptRegExp* regExObj = ToRegExp(thisObj, varName, scriptContext);
        return RegexHelper::RegexExec(scriptContext, regExObj, string, false);
    }